

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getLockingMode(char *z)

{
  byte bVar1;
  long lVar2;
  
  if (z == (char *)0x0) {
    return -1;
  }
  lVar2 = 0;
  do {
    bVar1 = z[lVar2];
    if (bVar1 == "exclusive"[lVar2]) {
      if ((ulong)bVar1 == 0) {
        return 1;
      }
    }
    else if (""[bVar1] != ""[(byte)"exclusive"[lVar2]]) {
      lVar2 = 0;
      do {
        bVar1 = z[lVar2];
        if (bVar1 == "normal"[lVar2]) {
          if ((ulong)bVar1 == 0) {
            return 0;
          }
        }
        else if (""[bVar1] != ""[(byte)"normal"[lVar2]]) {
          return -1;
        }
        lVar2 = lVar2 + 1;
      } while( true );
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static int getLockingMode(const char *z){
  if( z ){
    if( 0==sqlite3StrICmp(z, "exclusive") ) return PAGER_LOCKINGMODE_EXCLUSIVE;
    if( 0==sqlite3StrICmp(z, "normal") ) return PAGER_LOCKINGMODE_NORMAL;
  }
  return PAGER_LOCKINGMODE_QUERY;
}